

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfx2wav.cc
# Opt level: O2

void __thiscall
ConvertorSFX2WAV::ConvertorSFX2WAV(ConvertorSFX2WAV *this,PBuffer *_buffer,int _level,bool _invert)

{
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&_buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  ConvertorPCM2WAV::ConvertorPCM2WAV(&this->super_ConvertorPCM2WAV,(PBuffer *)&local_30,1,8000);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_ConvertorPCM2WAV).super_Convertor._vptr_Convertor =
       (_func_int **)&PTR__ConvertorPCM2WAV_001527f8;
  this->level = _level;
  this->invert = _invert;
  return;
}

Assistant:

ConvertorSFX2WAV::ConvertorSFX2WAV(PBuffer _buffer, int _level, bool _invert)
  : ConvertorPCM2WAV(_buffer, 1, 8000)
  , level(_level)
  , invert(_invert) {
}